

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CreateEvaluationSourceFiles(cmGlobalGenerator *this,string *config)

{
  bool bVar1;
  reference ppcVar2;
  cmLocalGenerator *localGen;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  string *config_local;
  cmGlobalGenerator *this_local;
  
  __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                     (&this->LocalGenerators);
  localGen = (cmLocalGenerator *)
             std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                       (&this->LocalGenerators);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                *)&localGen);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&__end1);
    cmLocalGenerator::CreateEvaluationFileOutputs(*ppcVar2,config);
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateEvaluationSourceFiles(
  std::string const& config) const
{
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    localGen->CreateEvaluationFileOutputs(config);
  }
}